

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternSelection.cpp
# Opt level: O2

TrackMeta __thiscall PatternSelection::Iterator::getTrackMeta(Iterator *this,int track)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  TrackMeta TVar5;
  
  uVar2 = 0;
  if ((this->mStart).super_PatternCursorBase.track == track) {
    uVar2 = (ulong)(uint)(this->mStart).super_PatternCursorBase.column;
  }
  if ((this->mEnd).super_PatternCursorBase.track == track) {
    uVar3 = (this->mEnd).super_PatternCursorBase.column;
  }
  else {
    uVar3 = 4;
  }
  iVar4 = 2;
  if (2 < (int)uVar2) {
    iVar4 = (int)uVar2;
  }
  TVar5.mEffectStart = iVar4 + -2;
  uVar1 = 1;
  if (1 < (int)uVar3) {
    uVar1 = uVar3;
  }
  TVar5._0_8_ = uVar2 | (ulong)uVar3 << 0x20;
  TVar5.mEffectEnd = uVar1 - 1;
  return TVar5;
}

Assistant:

PatternSelection::TrackMeta PatternSelection::Iterator::getTrackMeta(int track) const {
    int start;
    int end;

    if (track == mStart.track) {
        start = mStart.column;
    } else {
        start = 0;
    }

    if (track == mEnd.track) {
        end = mEnd.column;
    } else {
        end = PatternAnchor::MAX_SELECTS - 1;
    }

    return { start, end };
}